

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O3

Matrix<double> * __thiscall
nnad::Matrix<double>::PseudoInverse_LLR(Matrix<double> *__return_storage_ptr__,Matrix<double> *this)

{
  Matrix<double> temp_inverse;
  Matrix<double> temp;
  Matrix<double> local_70;
  Matrix<double> local_50;
  Matrix<double> local_30;
  
  local_70._Lines = this->_Lines;
  local_70._Columns = this->_Columns;
  std::vector<double,_std::allocator<double>_>::vector(&local_70._Matrix,&this->_Matrix);
  Transpose(&local_70);
  operator*(&local_30,this,&local_70);
  Inverse(&local_50,&local_30);
  operator*(__return_storage_ptr__,&local_70,&local_50);
  if (local_50._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_30._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix<T> PseudoInverse_LLR()
    {
      Matrix<T> transpose = (*this);
      transpose.Transpose();
      Matrix<T> temp = (*this) * transpose;
      Matrix<T> temp_inverse = temp.Inverse();
      Matrix<T> output = transpose * temp_inverse;
      return output;
    }